

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

secp256k1_context * secp256k1_context_preallocated_create(void *prealloc,uint flags)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  size_t sVar4;
  void *__src;
  secp256k1_context *psVar5;
  secp256k1_context *psVar6;
  int iVar7;
  void *in_RCX;
  uchar *p1;
  void *__dest;
  uint flags_00;
  uchar out [32];
  secp256k1_sha256 hasher;
  byte local_a8 [40];
  secp256k1_sha256 local_80;
  
  local_80.s[0] = 0x6a09e667;
  local_80.s[1] = 0xbb67ae85;
  local_80.s[2] = 0x3c6ef372;
  local_80.s[3] = 0xa54ff53a;
  local_80.s[4] = 0x510e527f;
  local_80.s[5] = 0x9b05688c;
  local_80.s[6] = 0x1f83d9ab;
  local_80.s[7] = 0x5be0cd19;
  local_80.bytes = 0;
  secp256k1_sha256_write
            (&local_80,(uchar *)"For this sample, this 63-byte string will be used as input data",
             0x3f);
  secp256k1_sha256_finalize(&local_80,local_a8);
  lVar3 = 0;
  do {
    __dest = (void *)((ulong)in_RCX & 0xffffffff);
    bVar1 = local_a8[lVar3];
    flags_00 = (uint)bVar1;
    bVar2 = (&secp256k1_selftest_sha256_output32)[lVar3];
    in_RCX = (void *)(ulong)((uint)bVar1 - (uint)bVar2);
    if (bVar1 == bVar2) {
      in_RCX = __dest;
    }
    iVar7 = (int)in_RCX;
    if (bVar1 != bVar2) goto LAB_0011352b;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x20);
  iVar7 = 0;
LAB_0011352b:
  if (iVar7 == 0) {
    sVar4 = secp256k1_context_preallocated_size(flags);
    if (sVar4 == 0) {
      prealloc = (secp256k1_context *)0x0;
    }
    else {
      *(secp256k1_callback *)((long)prealloc + 0xa8) = default_illegal_callback;
      *(secp256k1_callback *)((long)prealloc + 0xb8) = default_error_callback;
      secp256k1_ecmult_gen_blind((secp256k1_ecmult_gen_context *)prealloc,(uchar *)0x0);
      *(undefined4 *)prealloc = 1;
      *(uint *)((long)prealloc + 200) = flags >> 10 & 1;
    }
    return (secp256k1_context *)prealloc;
  }
  secp256k1_context_preallocated_create_cold_1();
  __src = (void *)secp256k1_context_preallocated_size(flags_00);
  psVar5 = (secp256k1_context *)malloc((size_t)__src);
  if (psVar5 != (secp256k1_context *)0x0) {
    psVar6 = secp256k1_context_preallocated_create(psVar5,flags_00);
    if (psVar6 == (secp256k1_context *)0x0) {
      free(psVar5);
      psVar5 = (secp256k1_context *)0x0;
    }
    return psVar5;
  }
  secp256k1_context_create_cold_1();
  if (__dest != (void *)0x0) {
    psVar5 = (secp256k1_context *)memcpy(__dest,__src,0xd0);
    return psVar5;
  }
  secp256k1_context_preallocated_clone_cold_1();
  return (secp256k1_context *)0x0;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_create(void* prealloc, unsigned int flags) {
    size_t prealloc_size;
    secp256k1_context* ret;

    if (!secp256k1_selftest()) {
        secp256k1_callback_call(&default_error_callback, "self test failed");
    }

    prealloc_size = secp256k1_context_preallocated_size(flags);
    if (prealloc_size == 0) {
        return NULL;
    }
    VERIFY_CHECK(prealloc != NULL);
    ret = (secp256k1_context*)prealloc;
    ret->illegal_callback = default_illegal_callback;
    ret->error_callback = default_error_callback;

    /* Flags have been checked by secp256k1_context_preallocated_size. */
    VERIFY_CHECK((flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_CONTEXT);
    secp256k1_ecmult_gen_context_build(&ret->ecmult_gen_ctx);
    ret->declassify = !!(flags & SECP256K1_FLAGS_BIT_CONTEXT_DECLASSIFY);

    return ret;
}